

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::Walk
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNode *pnode,Context context)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ParseNodeCall *pnode_00;
  ParseNodeTri *pnode_01;
  ParseNodeVar *pnode_02;
  ParseNodeFnc *pnode_03;
  ParseNodeProg *pnode_04;
  ParseNodeFor *pnode_05;
  ParseNodeIf *pnode_06;
  ParseNodeWhile *pPVar4;
  ParseNodeForInOrForOf *pPVar5;
  ParseNodeReturn *pnode_07;
  ParseNodeBlock *pnode_08;
  ParseNodeWith *pnode_09;
  ParseNodeSwitch *pnode_10;
  ParseNodeCase *pnode_11;
  ParseNodeTryFinally *pnode_12;
  ParseNodeFinally *pnode_13;
  ParseNodeCatch *pnode_14;
  ParseNodeTryCatch *pnode_15;
  ParseNodeTry *pnode_16;
  ParseNodeStrTemplate *pnode_17;
  ParseNodeClass *pnode_18;
  ParseNodeExportDefault *pPVar6;
  ParseNodeBin *pnode_19;
  ParseNodeUni *pPVar7;
  undefined4 *puVar8;
  uint fnop;
  Context context_local;
  ParseNode *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  context_local = (Context)pnode;
  pnode_local = (ParseNode *)this;
  if (pnode == (ParseNode *)0x0) {
    this_local._7_1_ =
         WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::DefaultResult
                   ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this);
  }
  else {
    switch(pnode->nop) {
    case knopIncPost:
    case knopDecPost:
      pPVar7 = ParseNode::AsParseNodeUni(pnode);
      this_local._7_1_ = WalkPostUnary(this,pPVar7,context);
      break;
    default:
      uVar3 = ParseNode::Grfnop((uint)pnode->nop);
      if ((uVar3 & 2) == 0) {
        if ((uVar3 & 8) == 0) {
          if ((uVar3 & 4) == 0) {
            if ((uVar3 & 0x400) == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar8 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/pnodewalk.h"
                                 ,0x234,"(false)","false");
              if (bVar2) {
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar8 = 0;
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            this_local._7_1_ = WalkLeaf(this,(ParseNode *)context_local,context);
          }
          else {
            pPVar7 = ParseNode::AsParseNodeUni((ParseNode *)context_local);
            this_local._7_1_ = WalkPreUnary(this,pPVar7,context);
          }
        }
        else {
          pnode_19 = ParseNode::AsParseNodeBin((ParseNode *)context_local);
          this_local._7_1_ = WalkBinary(this,pnode_19,context);
        }
      }
      else {
        this_local._7_1_ = WalkLeaf(this,(ParseNode *)context_local,context);
      }
      break;
    case knopCall:
    case knopNew:
      pnode_00 = ParseNode::AsParseNodeCall(pnode);
      this_local._7_1_ = WalkCall(this,pnode_00,context);
      break;
    case knopQmark:
      pnode_01 = ParseNode::AsParseNodeTri(pnode);
      this_local._7_1_ = WalkTernary(this,pnode_01,context);
      break;
    case knopList:
      this_local._7_1_ = WalkList(this,(ParseNode *)0x0,(ParseNode **)&context_local,context);
      break;
    case knopVarDecl:
    case knopConstDecl:
    case knopLetDecl:
    case knopTemp:
      pnode_02 = ParseNode::AsParseNodeVar(pnode);
      this_local._7_1_ = WalkVar(this,pnode_02,context);
      break;
    case knopFncDecl:
      pnode_03 = ParseNode::AsParseNodeFnc(pnode);
      this_local._7_1_ = WalkFnc(this,pnode_03,context);
      break;
    case knopClassDecl:
      pnode_18 = ParseNode::AsParseNodeClass(pnode);
      this_local._7_1_ = WalkClass(this,pnode_18,context);
      break;
    case knopProg:
      pnode_04 = ParseNode::AsParseNodeProg(pnode);
      this_local._7_1_ = WalkProg(this,pnode_04,context);
      break;
    case knopFor:
      pnode_05 = ParseNode::AsParseNodeFor(pnode);
      this_local._7_1_ = WalkFor(this,pnode_05,context);
      break;
    case knopIf:
      pnode_06 = ParseNode::AsParseNodeIf(pnode);
      this_local._7_1_ = WalkIf(this,pnode_06,context);
      break;
    case knopWhile:
      pPVar4 = ParseNode::AsParseNodeWhile(pnode);
      this_local._7_1_ = WalkWhile(this,pPVar4,context);
      break;
    case knopDoWhile:
      pPVar4 = ParseNode::AsParseNodeWhile(pnode);
      this_local._7_1_ = WalkDoWhile(this,pPVar4,context);
      break;
    case knopForIn:
      pPVar5 = ParseNode::AsParseNodeForInOrForOf(pnode);
      this_local._7_1_ = WalkForInOrForOf(this,pPVar5,context);
      break;
    case knopForOf:
      pPVar5 = ParseNode::AsParseNodeForInOrForOf(pnode);
      this_local._7_1_ = WalkForInOrForOf(this,pPVar5,context);
      break;
    case knopForAwaitOf:
      pPVar5 = ParseNode::AsParseNodeForInOrForOf(pnode);
      this_local._7_1_ = WalkForInOrForOf(this,pPVar5,context);
      break;
    case knopBlock:
      pnode_08 = ParseNode::AsParseNodeBlock(pnode);
      this_local._7_1_ = WalkBlock(this,pnode_08,context);
      break;
    case knopStrTemplate:
      pnode_17 = ParseNode::AsParseNodeStrTemplate(pnode);
      this_local._7_1_ = WalkStringTemplate(this,pnode_17,context);
      break;
    case knopWith:
      pnode_09 = ParseNode::AsParseNodeWith(pnode);
      this_local._7_1_ = WalkWith(this,pnode_09,context);
      break;
    case knopSwitch:
      pnode_10 = ParseNode::AsParseNodeSwitch(pnode);
      this_local._7_1_ = WalkSwitch(this,pnode_10,context);
      break;
    case knopCase:
      pnode_11 = ParseNode::AsParseNodeCase(pnode);
      this_local._7_1_ = WalkCase(this,pnode_11,context);
      break;
    case knopTryCatch:
      pnode_15 = ParseNode::AsParseNodeTryCatch(pnode);
      this_local._7_1_ = WalkTryCatch(this,pnode_15,context);
      break;
    case knopCatch:
      pnode_14 = ParseNode::AsParseNodeCatch(pnode);
      this_local._7_1_ = WalkCatch(this,pnode_14,context);
      break;
    case knopReturn:
      pnode_07 = ParseNode::AsParseNodeReturn(pnode);
      this_local._7_1_ = WalkReturn(this,pnode_07,context);
      break;
    case knopTry:
      pnode_16 = ParseNode::AsParseNodeTry(pnode);
      this_local._7_1_ = WalkTry(this,pnode_16,context);
      break;
    case knopThrow:
      pPVar7 = ParseNode::AsParseNodeUni(pnode);
      this_local._7_1_ = WalkPostUnary(this,pPVar7,context);
      break;
    case knopFinally:
      pnode_13 = ParseNode::AsParseNodeFinally(pnode);
      this_local._7_1_ = WalkFinally(this,pnode_13,context);
      break;
    case knopTryFinally:
      pnode_12 = ParseNode::AsParseNodeTryFinally(pnode);
      this_local._7_1_ = WalkTryFinally(this,pnode_12,context);
      break;
    case knopExportDefault:
      pPVar6 = ParseNode::AsParseNodeExportDefault(pnode);
      this_local._7_1_ = Walk(this,pPVar6->pnodeExpr,context);
    }
  }
  return this_local._7_1_;
}

Assistant:

ResultType Walk(ParseNode *pnode, Context context)
    {
        if (!pnode) return DefaultResult();

        switch (pnode->nop) {
        // Handle all special cases first.

        // Post-fix unary operators.
        //PTNODE(knopIncPost    , "++ post"    ,Inc     ,Uni  ,fnopUni|fnopAsg)
        //PTNODE(knopDecPost    , "-- post"    ,Dec     ,Uni  ,fnopUni|fnopAsg)
        case knopIncPost:
        case knopDecPost:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        // Call and call like
        //PTNODE(knopCall       , "()"        ,None    ,Bin  ,fnopBin)
        //PTNODE(knopNew        , "new"        ,None    ,Bin  ,fnopBin)
        case knopCall:
        case knopNew:
            return WalkCall(pnode->AsParseNodeCall(), context);

        // Ternary operator
        //PTNODE(knopQmark      , "?"            ,None    ,Tri  ,fnopBin)
        case knopQmark:
            return WalkTernary(pnode->AsParseNodeTri(), context);

        // General nodes.
        //PTNODE(knopList       , "<list>"    ,None    ,Bin  ,fnopNone)
        case knopList:
            return WalkList(NULL, pnode, context);

        //PTNODE(knopVarDecl    , "varDcl"    ,None    ,Var  ,fnopNone)
        case knopVarDecl:
        case knopConstDecl:
        case knopLetDecl:
        case knopTemp:
            return WalkVar(pnode->AsParseNodeVar(), context);

        //PTNODE(knopFncDecl    , "fncDcl"    ,None    ,Fnc  ,fnopLeaf)
        case knopFncDecl:
            return WalkFnc(pnode->AsParseNodeFnc(), context);

        //PTNODE(knopProg       , "program"    ,None    ,Fnc  ,fnopNone)
        case knopProg:
            return WalkProg(pnode->AsParseNodeProg(), context);

        //PTNODE(knopFor        , "for"        ,None    ,For  ,fnopBreak|fnopContinue)
        case knopFor:
            return WalkFor(pnode->AsParseNodeFor(), context);

        //PTNODE(knopIf         , "if"        ,None    ,If   ,fnopNone)
        case knopIf:
            return WalkIf(pnode->AsParseNodeIf(), context);

        //PTNODE(knopWhile      , "while"        ,None    ,While,fnopBreak|fnopContinue)
        case knopWhile:
            return WalkWhile(pnode->AsParseNodeWhile(), context);

         //PTNODE(knopDoWhile    , "do-while"    ,None    ,While,fnopBreak|fnopContinue)
        case knopDoWhile:
            return WalkDoWhile(pnode->AsParseNodeWhile(), context);

        //PTNODE(knopForIn      , "for in"    ,None    ,ForIn,fnopBreak|fnopContinue|fnopCleanup)
        case knopForIn:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        case knopForAwaitOf:
            return WalkForInOrForOf(pnode->AsParseNodeForInOrForOf(), context);

        //PTNODE(knopReturn     , "return"    ,None    ,Uni  ,fnopNone)
        case knopReturn:
            return WalkReturn(pnode->AsParseNodeReturn(), context);

        //PTNODE(knopBlock      , "{}"        ,None    ,Block,fnopNone)
        case knopBlock:
            return WalkBlock(pnode->AsParseNodeBlock(), context);

        //PTNODE(knopWith       , "with"        ,None    ,With ,fnopCleanup)
        case knopWith:
            return WalkWith(pnode->AsParseNodeWith(), context);

        //PTNODE(knopSwitch     , "switch"    ,None    ,Switch,fnopBreak)
        case knopSwitch:
            return WalkSwitch(pnode->AsParseNodeSwitch(), context);

        //PTNODE(knopCase       , "case"        ,None    ,Case ,fnopNone)
        case knopCase:
            return WalkCase(pnode->AsParseNodeCase(), context);

        //PTNODE(knopTryFinally,"try-finally",None,TryFinally,fnopCleanup)
        case knopTryFinally:
            return WalkTryFinally(pnode->AsParseNodeTryFinally(), context);

       case knopFinally:
           return WalkFinally(pnode->AsParseNodeFinally(), context);

        //PTNODE(knopCatch      , "catch"     ,None    ,Catch,fnopNone)
        case knopCatch:
            return WalkCatch(pnode->AsParseNodeCatch(), context);

        //PTNODE(knopTryCatch      , "try-catch" ,None    ,TryCatch  ,fnopCleanup)
        case knopTryCatch:
            return WalkTryCatch(pnode->AsParseNodeTryCatch(), context);

        //PTNODE(knopTry        , "try"       ,None    ,Try  ,fnopCleanup)
        case knopTry:
            return WalkTry(pnode->AsParseNodeTry(), context);

        //PTNODE(knopThrow      , "throw"     ,None    ,Uni  ,fnopNone)
        case knopThrow:
            return WalkPostUnary(pnode->AsParseNodeUni(), context);

        case knopStrTemplate:
            return WalkStringTemplate(pnode->AsParseNodeStrTemplate(), context);

        //PTNODE(knopClassDecl  , "classDecl" ,None    ,Class       ,fnopLeaf)
        case knopClassDecl:
            return WalkClass(pnode->AsParseNodeClass(), context);

        case knopExportDefault:
            return Walk(pnode->AsParseNodeExportDefault()->pnodeExpr, context);

        default:
        {
            uint fnop = ParseNode::Grfnop(pnode->nop);

            if (fnop & fnopLeaf || fnop & fnopNone)
            {
                return WalkLeaf(pnode, context);
            }
            else if (fnop & fnopBin)
            {
                return WalkBinary(pnode->AsParseNodeBin(), context);
            }
            else if (fnop & fnopUni)
            {
                // Prefix unary operators.
                return WalkPreUnary(pnode->AsParseNodeUni(), context);
            }

            // Some node types are both fnopNotExprStmt and something else. Try the above cases first and fall back to this one.
            if (fnop & fnopNotExprStmt)
            {
                return WalkLeaf(pnode, context);
            }

            Assert(false);
            __assume(false);
        }
        }
    }